

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O3

void lysp_ident_free(lysf_ctx *ctx,lysp_ident *ident)

{
  undefined8 *puVar1;
  lysp_ext_instance *plVar2;
  lysp_qname *plVar3;
  char **ppcVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  lysp_ext_instance *plVar8;
  
  lydict_remove(ctx->ctx,ident->name);
  plVar3 = ident->iffeatures;
  if (plVar3 != (lysp_qname *)0x0) {
    uVar6 = 0xffffffffffffffff;
    lVar5 = 0;
    do {
      uVar6 = uVar6 + 1;
      if (*(ulong *)&plVar3[-1].flags <= uVar6) {
        free(&plVar3[-1].flags);
        break;
      }
      puVar1 = (undefined8 *)((long)&plVar3->str + lVar5);
      lVar5 = lVar5 + 0x18;
      lydict_remove(ctx->ctx,(char *)*puVar1);
      plVar3 = ident->iffeatures;
    } while (plVar3 != (lysp_qname *)0x0);
  }
  ppcVar4 = ident->bases;
  if (ppcVar4 != (char **)0x0) {
    pcVar7 = (char *)0x0;
    do {
      if (ppcVar4[-1] <= pcVar7) {
        free(ppcVar4 + -1);
        break;
      }
      lydict_remove(ctx->ctx,ppcVar4[(long)pcVar7]);
      pcVar7 = pcVar7 + 1;
      ppcVar4 = ident->bases;
    } while (ppcVar4 != (char **)0x0);
  }
  lydict_remove(ctx->ctx,ident->dsc);
  lydict_remove(ctx->ctx,ident->ref);
  plVar2 = ident->exts;
  if (plVar2 != (lysp_ext_instance *)0x0) {
    plVar8 = (lysp_ext_instance *)0xffffffffffffffff;
    lVar5 = 0;
    do {
      plVar8 = (lysp_ext_instance *)((long)&plVar8->name + 1);
      if (plVar2[-1].exts <= plVar8) {
        free(&plVar2[-1].exts);
        return;
      }
      plVar2 = (lysp_ext_instance *)((long)&plVar2->name + lVar5);
      lVar5 = lVar5 + 0x70;
      lysp_ext_instance_free(ctx,plVar2);
      plVar2 = ident->exts;
    } while (plVar2 != (lysp_ext_instance *)0x0);
  }
  return;
}

Assistant:

static void
lysp_ident_free(struct lysf_ctx *ctx, struct lysp_ident *ident)
{
    lydict_remove(ctx->ctx, ident->name);
    FREE_ARRAY(ctx->ctx, ident->iffeatures, lysp_qname_free);
    FREE_STRINGS(ctx->ctx, ident->bases);
    lydict_remove(ctx->ctx, ident->dsc);
    lydict_remove(ctx->ctx, ident->ref);
    FREE_ARRAY(ctx, ident->exts, lysp_ext_instance_free);
}